

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

void write<unsigned_long>
               (vector<char,_std::allocator<char>_> *buffer,size_t *position,unsigned_long *x,
               size_t count)

{
  ulong uVar1;
  float fVar2;
  
  if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
             (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start) < *position + count) {
    fVar2 = (float)(*position + count) * 1.5;
    uVar1 = (ulong)fVar2;
    std::vector<char,_std::allocator<char>_>::reserve
              (buffer,(long)(fVar2 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1);
  }
  if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start) < *position + count) {
    std::vector<char,_std::allocator<char>_>::resize(buffer,*position + count);
  }
  if (count != 0) {
    memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + *position,x,count);
  }
  *position = *position + count;
  return;
}

Assistant:

void write(std::vector<char>& buffer, size_t& position, const T& x, size_t count = sizeof(T))
{
    if (position + count > buffer.capacity())
        buffer.reserve((position + count) * growth_multiplier);         // if we have to grow, grow geometrically

    if (position + count > buffer.size())
        buffer.resize(position + count);

    const char* x_ptr = (const char*) &x;
    std::copy(x_ptr, x_ptr + count, &buffer[position]);
    position += count;
}